

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprintint.h
# Opt level: O0

int print_uint32(uint32_t n,char *p)

{
  uint uVar1;
  char *dp;
  char *pcStack_18;
  int k;
  char *p_local;
  uint32_t n_local;
  
  if (n < 10000) {
    if (n < 100) {
      if (n < 10) {
        dp._4_4_ = 1;
      }
      else {
        dp._4_4_ = 2;
      }
    }
    else if (n < 1000) {
      dp._4_4_ = 3;
    }
    else {
      dp._4_4_ = 4;
    }
  }
  else if (n < 10000000) {
    if (n < 1000000) {
      if (n < 100000) {
        dp._4_4_ = 5;
      }
      else {
        dp._4_4_ = 6;
      }
    }
    else {
      dp._4_4_ = 7;
    }
  }
  else if (n < 1000000000) {
    if (n < 100000000) {
      dp._4_4_ = 8;
    }
    else {
      dp._4_4_ = 9;
    }
  }
  else {
    dp._4_4_ = 10;
  }
  pcStack_18 = p + (int)dp._4_4_;
  *pcStack_18 = '\0';
  p_local._4_4_ = n;
  if ((dp._4_4_ & 1) == 0) {
    switch(dp._4_4_) {
    case 10:
      pcStack_18 = pcStack_18 + -2;
      p_local._4_4_ = n / 100;
      *(undefined2 *)pcStack_18 =
           *(undefined2 *)
            (
            "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
            + (n % 100 << 1));
    case 8:
      pcStack_18 = pcStack_18 + -2;
      uVar1 = p_local._4_4_ % 100;
      p_local._4_4_ = p_local._4_4_ / 100;
      *(undefined2 *)pcStack_18 =
           *(undefined2 *)
            (
            "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
            + (uVar1 << 1));
    case 6:
      pcStack_18 = pcStack_18 + -2;
      uVar1 = p_local._4_4_ % 100;
      p_local._4_4_ = p_local._4_4_ / 100;
      *(undefined2 *)pcStack_18 =
           *(undefined2 *)
            (
            "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
            + (uVar1 << 1));
    case 4:
      pcStack_18 = pcStack_18 + -2;
      uVar1 = p_local._4_4_ % 100;
      p_local._4_4_ = p_local._4_4_ / 100;
      *(undefined2 *)pcStack_18 =
           *(undefined2 *)
            (
            "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
            + (uVar1 << 1));
    case 2:
      *(undefined2 *)(pcStack_18 + -2) =
           *(undefined2 *)
            (
            "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
            + (p_local._4_4_ % 100 << 1));
    default:
    }
  }
  else {
    switch(dp._4_4_) {
    case 9:
      pcStack_18 = pcStack_18 + -2;
      p_local._4_4_ = n / 100;
      *(undefined2 *)pcStack_18 =
           *(undefined2 *)
            (
            "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
            + (n % 100 << 1));
    case 7:
      pcStack_18 = pcStack_18 + -2;
      uVar1 = p_local._4_4_ % 100;
      p_local._4_4_ = p_local._4_4_ / 100;
      *(undefined2 *)pcStack_18 =
           *(undefined2 *)
            (
            "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
            + (uVar1 << 1));
    case 5:
      pcStack_18 = pcStack_18 + -2;
      uVar1 = p_local._4_4_ % 100;
      p_local._4_4_ = p_local._4_4_ / 100;
      *(undefined2 *)pcStack_18 =
           *(undefined2 *)
            (
            "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
            + (uVar1 << 1));
    case 3:
      pcStack_18 = pcStack_18 + -2;
      uVar1 = p_local._4_4_ % 100;
      p_local._4_4_ = p_local._4_4_ / 100;
      *(undefined2 *)pcStack_18 =
           *(undefined2 *)
            (
            "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
            + (uVar1 << 1));
    case 1:
      pcStack_18[-1] = (char)p_local._4_4_ + '0';
    default:
    }
  }
  return dp._4_4_;
}

Assistant:

static int print_uint32(uint32_t n, char *p)
{
    int k = 0;
    const char *dp;

    if(n >= 10000UL) {
        if(n >= 10000000UL) {
            if(n >= 1000000000UL) {
                k = 10;
            } else if(n >= 100000000UL) {
                k = 9;
            } else {
               k = 8;
            }
        } else {
            if(n >= 1000000UL) {
                k = 7;
            } else if(n >= 100000UL) {
                k = 6;
            } else {
                k = 5;
            }
        }
    } else {
        if(n >= 100UL) {
            if(n >= 1000UL) {
                k = 4;
            } else {
                k = 3;
            }
        } else {
            if(n >= 10UL) {
                k = 2;
            } else {
                k = 1UL;
            }
        }
    }
    p += k;
    *p = '\0';
    if (k & 1) {
        switch (k) {
        case 9:
            __print_stage();
	    pattribute(fallthrough);
        case 7:
            __print_stage();
	    pattribute(fallthrough);
        case 5:
            __print_stage();
	    pattribute(fallthrough);
        case 3:
            __print_stage();
	    pattribute(fallthrough);
        case 1:
            p[-1] = (char)n + '0';
        }
    } else {
        switch (k) {
        case 10:
            __print_stage();
	    pattribute(fallthrough);
        case 8:
            __print_stage();
	    pattribute(fallthrough);
        case 6:
            __print_stage();
	    pattribute(fallthrough);
        case 4:
            __print_stage();
	    pattribute(fallthrough);
        case 2:
            __print_stage();
        }
    }
    return k;
}